

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  char *__s;
  int iVar1;
  size_t sVar2;
  TProblem p;
  allocator<char> local_149;
  string local_148;
  vector<TCacheReq,_std::allocator<TCacheReq>_> local_128;
  TProblem local_110;
  
  if (argc == 3) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_148,argv[1],(allocator<char> *)&local_128);
    Read(&local_110,&local_148);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_148._M_dataplus._M_p != &local_148.field_2) {
      operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_148,argv[2],&local_149);
    PriorityQueueAssignment(&local_128,&local_110);
    Write(&local_148,&local_128);
    if (local_128.super__Vector_base<TCacheReq,_std::allocator<TCacheReq>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_128.super__Vector_base<TCacheReq,_std::allocator<TCacheReq>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_128.super__Vector_base<TCacheReq,_std::allocator<TCacheReq>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_128.super__Vector_base<TCacheReq,_std::allocator<TCacheReq>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_148._M_dataplus._M_p != &local_148.field_2) {
      operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
    }
    std::
    _Hashtable<TEndpointVideo,_std::pair<const_TEndpointVideo,_unsigned_long>,_std::allocator<std::pair<const_TEndpointVideo,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<TEndpointVideo>,_std::hash<TEndpointVideo>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable(&local_110.RequestsCount._M_h);
    std::
    _Hashtable<TEndpointCache,_std::pair<const_TEndpointCache,_unsigned_long>,_std::allocator<std::pair<const_TEndpointCache,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<TEndpointCache>,_std::hash<TEndpointCache>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable(&local_110.Latencies._M_h);
    if (local_110.Capacities.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_110.Capacities.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_110.Capacities.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_110.Capacities.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    std::
    vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
    ::~vector(&local_110.VideoEndpoints);
    if (local_110.Requests.super__Vector_base<TRequest,_std::allocator<TRequest>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_110.Requests.super__Vector_base<TRequest,_std::allocator<TRequest>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_110.Requests.
                            super__Vector_base<TRequest,_std::allocator<TRequest>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_110.Requests.
                            super__Vector_base<TRequest,_std::allocator<TRequest>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    std::vector<TEndpoint,_std::allocator<TEndpoint>_>::~vector(&local_110.Endpoints);
    if (local_110.Vides.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_110.Vides.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_110.Vides.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_110.Vides.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    iVar1 = 0;
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"usage: ",7);
    __s = *argv;
    if (__s == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x10a140);
    }
    else {
      sVar2 = strlen(__s);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,__s,sVar2);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," INPUT OUTPUT",0xd);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '@');
    std::ostream::put('@');
    std::ostream::flush();
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

int main(int argc, char* argv[]) {
    if (argc != 3) {
        std::cerr << "usage: " << argv[0] << " INPUT OUTPUT" << std::endl;
        return 1;
    }

    auto p = Read(argv[1]);

    Write(argv[2], PriorityQueueAssignment(p));

    return 0;
}